

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_dictionary.hpp
# Opt level: O1

bool pd::readWordsVec(string *dict_filename,
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
                     *words_dict)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  pointer pbVar4;
  _Alloc_hider _Var5;
  char cVar6;
  int iVar7;
  ostream *poVar8;
  int *piVar9;
  ulonglong uVar10;
  istream *piVar11;
  undefined8 uVar12;
  ulong uVar13;
  undefined1 auStack_468 [8];
  istringstream is;
  ios_base local_3f0 [264];
  long local_2e8;
  ifstream fi;
  uint auStack_2c8 [122];
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<double,std::allocator<double>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_e0;
  ulong local_d8;
  undefined1 auStack_d0 [8];
  string word;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  coords;
  vector<double,_std::allocator<double>_> items_1;
  undefined1 local_78 [8];
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  double local_38;
  double x;
  
  std::ifstream::ifstream(&local_2e8,(string *)dict_filename,_S_in);
  uVar1 = *(uint *)((long)auStack_2c8 + *(long *)(local_2e8 + -0x18));
  if ((uVar1 & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(dict_filename->_M_dataplus)._M_p,
                        dict_filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," doesn\'t exist",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    goto LAB_0010db5a;
  }
  local_78 = (undefined1  [8])&line._M_string_length;
  line._M_dataplus._M_p = (pointer)0x0;
  line._M_string_length._0_1_ = 0;
  local_e0 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<double,std::allocator<double>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)words_dict;
  cVar6 = std::ios::widen((char)&local_2e8 + (char)*(undefined8 *)(local_2e8 + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&local_2e8,(string *)local_78,cVar6);
  line.field_2._8_8_ = 0;
  ex::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_d0,(string *)local_78,' ');
  auStack_468 = (undefined1  [8])line.field_2._8_8_;
  _Var5 = word._M_dataplus;
  line.field_2._8_8_ = auStack_d0;
  _is = (pointer)0x0;
  auStack_d0 = (undefined1  [8])0x0;
  word._M_dataplus._M_p = (pointer)0x0;
  word._M_string_length = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_468);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_d0);
  if ((long)_Var5._M_p - line.field_2._8_8_ != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(dict_filename->_M_dataplus)._M_p,
                        dict_filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," has incorrect format (wrong first line)",0x28);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  pbVar4 = *(pointer *)(line.field_2._8_8_ + 0x20);
  piVar9 = __errno_location();
  iVar2 = *piVar9;
  *piVar9 = 0;
  uVar10 = strtoull((char *)pbVar4,(char **)auStack_468,10);
  iVar7 = (int)uVar10;
  if (auStack_468 == (undefined1  [8])pbVar4) {
    uVar12 = std::__throw_invalid_argument("stoull");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&line.field_2 + 8));
    if (local_78 != (undefined1  [8])&line._M_string_length) {
      operator_delete((void *)local_78);
    }
    std::ifstream::~ifstream(&local_2e8);
    _Unwind_Resume(uVar12);
  }
  if (*piVar9 == 0) {
LAB_0010d887:
    *piVar9 = iVar2;
  }
  else if (*piVar9 == 0x22) {
    iVar7 = std::__throw_out_of_range("stoull");
    goto LAB_0010d887;
  }
  uVar13 = (ulong)(iVar7 + 1);
  local_d8 = uVar13;
  while( true ) {
    cVar6 = std::ios::widen((char)*(undefined8 *)(local_2e8 + -0x18) + (char)(istream *)&local_2e8);
    piVar11 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&local_2e8,(string *)local_78,cVar6);
    if ((((byte)piVar11[*(long *)(*(long *)piVar11 + -0x18) + 0x20] & 5) != 0) ||
       (line._M_dataplus._M_p == (pointer)0x0)) break;
    ex::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&word.field_2 + 8),(string *)local_78,' ');
    if ((long)coords.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start - word.field_2._8_8_ >> 5 == uVar13) {
      auStack_d0 = (undefined1  [8])&word._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)auStack_d0,*(long *)word.field_2._8_8_,
                 *(long *)(word.field_2._8_8_ + 8) + *(long *)word.field_2._8_8_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&word.field_2 + 8),(iterator)word.field_2._8_8_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (word.field_2._8_8_ + 0x20));
      pbVar4 = coords.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      coords.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      items_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      for (uVar12 = word.field_2._8_8_; (pointer)uVar12 != pbVar4; uVar12 = uVar12 + 0x20) {
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)auStack_468,(string *)uVar12,_S_in);
        local_38 = 0.0;
        piVar11 = std::istream::_M_extract<double>((double *)auStack_468);
        uVar3 = *(uint *)(piVar11 + *(long *)(*(long *)piVar11 + -0x18) + 0x20);
        if ((uVar3 & 5) == 0) {
          if (items_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start == (pointer)0x0) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)
                       &coords.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(iterator)0x0,&local_38);
          }
          else {
            *items_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start = local_38;
            items_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start =
                 items_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Line ",5);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(char *)local_78,(long)line._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," has incorrect numbers",0x16);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)auStack_468);
        std::ios_base::~ios_base(local_3f0);
        if ((uVar3 & 5) != 0) break;
      }
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<double,std::allocator<double>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::__cxx11::string&,std::vector<double,std::allocator<double>>&>
                (local_e0,auStack_d0,
                 &coords.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      uVar13 = local_d8;
      if (coords.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(coords.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if (auStack_d0 != (undefined1  [8])&word._M_string_length) {
        operator_delete((void *)auStack_d0);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Incorrect line ",0xf);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_78,(long)line._M_dataplus._M_p);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&word.field_2 + 8));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&line.field_2 + 8));
  if (local_78 != (undefined1  [8])&line._M_string_length) {
    operator_delete((void *)local_78);
  }
LAB_0010db5a:
  std::ifstream::~ifstream(&local_2e8);
  return (uVar1 & 5) == 0;
}

Assistant:

bool readWordsVec(const std::string& dict_filename, std::unordered_map<std::string, std::vector<double>>& words_dict)
    {
        std::ifstream fi(dict_filename);
        if (not fi)
        {
            std::cerr << "File " << dict_filename << " doesn't exist" << std::endl;
            return false;
        }

        std::string line;
        
        //read first line and get number of features
        std::getline(fi, line);
        std::vector<std::string> items;
        items = ex::split(line, ' ');
        if (items.size() != 2)
            std::cerr << "File " << dict_filename << " has incorrect format (wrong first line)" << std::endl;
        
        uint32_t num_features = 0;
        try
        {
            num_features = std::stoull(items[1]);
        }
        catch (std::invalid_argument& exc)
        {
            std::cerr << "Incorrect first line of file " << dict_filename << std::endl;
        }
        
        while (std::getline(fi, line) and !line.empty())
        {
            std::vector<std::string> coords = ex::split(line, ' ');
            if (coords.size() != num_features + 1)
            {
                std::cerr << "Incorrect line " << line << std::endl; 
                continue;
            }
            
            std::string word = coords[0];
            coords.erase(coords.begin(), coords.begin() + 1);
            std::vector<double> items; 
            for (const std::string& s: coords)
            {
                std::istringstream is(s);
                double x = 0;
                if (!(is >> x))
                {
                    std::cerr << "Line " << line << " has incorrect numbers" << std::endl;
                    break;
                }
                items.push_back(x);
            }                     
            words_dict.emplace(word, items);
        }        
        return true;
    }